

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqpvalue.c
# Opt level: O2

AMQP_VALUE amqpvalue_get_map_value(AMQP_VALUE map,AMQP_VALUE key)

{
  AMQP_VALUE value;
  _Bool _Var1;
  uint uVar2;
  LOGGER_LOG p_Var3;
  ulong uVar4;
  long lVar5;
  
  if (map == (AMQP_VALUE)0x0 || key == (AMQP_VALUE)0x0) {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_map_value",0x67e,1,"Bad arguments: map = %p, key = %p",map,key);
      return (AMQP_VALUE)0x0;
    }
  }
  else if (map->type == AMQP_TYPE_MAP) {
    lVar5 = 0;
    for (uVar4 = 0; uVar2 = (map->value).binary_value.length, uVar4 < uVar2; uVar4 = uVar4 + 1) {
      _Var1 = amqpvalue_are_equal(*(AMQP_VALUE *)
                                   ((long)&((map->value).described_value.descriptor)->type + lVar5),
                                  key);
      if (_Var1) {
        uVar2 = (map->value).binary_value.length;
        break;
      }
      lVar5 = lVar5 + 0x10;
    }
    if (uVar2 != (uint)uVar4) {
      value = *(AMQP_VALUE *)((long)&((map->value).described_value.descriptor)->value + lVar5);
      amqpvalue_clone(value);
      return value;
    }
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 != (LOGGER_LOG)0x0) {
      (*p_Var3)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/src/amqpvalue.c"
                ,"amqpvalue_get_map_value",0x688,1,"Value is not of type MAP");
      return (AMQP_VALUE)0x0;
    }
  }
  return (AMQP_VALUE)0x0;
}

Assistant:

AMQP_VALUE amqpvalue_get_map_value(AMQP_VALUE map, AMQP_VALUE key)
{
    AMQP_VALUE result;

    /* Codes_SRS_AMQPVALUE_01_190: [If any argument is NULL, amqpvalue_get_map_value shall return NULL.] */
    if ((map == NULL) ||
        (key == NULL))
    {
        LogError("Bad arguments: map = %p, key = %p",
            map, key);
        result = NULL;
    }
    else
    {
        AMQP_VALUE_DATA* value_data = (AMQP_VALUE_DATA*)map;

        /* Codes_SRS_AMQPVALUE_01_197: [If the map argument is not an AMQP value created with the amqpvalue_create_map function than amqpvalue_get_map_value shall return NULL.] */
        if (value_data->type != AMQP_TYPE_MAP)
        {
            LogError("Value is not of type MAP");
            result = NULL;
        }
        else
        {
            uint32_t i;

            for (i = 0; i < value_data->value.map_value.pair_count; i++)
            {
                if (amqpvalue_are_equal(value_data->value.map_value.pairs[i].key, key))
                {
                    break;
                }
            }

            if (i == value_data->value.map_value.pair_count)
            {
                /* Codes_SRS_AMQPVALUE_01_191: [If the key cannot be found, amqpvalue_get_map_value shall return NULL.] */
                result = NULL;
            }
            else
            {
                /* Codes_SRS_AMQPVALUE_01_189: [amqpvalue_get_map_value shall return the value whose key is identified by the key argument.] */
                /* Codes_SRS_AMQPVALUE_01_192: [The returned value shall be a clone of the actual value stored in the map.] */
                result = amqpvalue_clone(value_data->value.map_value.pairs[i].value);
            }
        }
    }

    return result;
}